

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O0

TestOutput * __thiscall
CommandLineTestRunner::createCompositeOutput
          (CommandLineTestRunner *this,TestOutput *outputOne,TestOutput *outputTwo)

{
  TestOutput *pTVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  CompositeTestOutput *composite;
  char *in_stack_ffffffffffffffc8;
  CompositeTestOutput *in_stack_ffffffffffffffd0;
  
  pTVar1 = (TestOutput *)
           operator_new((size_t)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x1750a9);
  CompositeTestOutput::CompositeTestOutput(in_stack_ffffffffffffffd0);
  (*pTVar1->_vptr_TestOutput[0x17])(pTVar1,in_RSI);
  (*pTVar1->_vptr_TestOutput[0x18])(pTVar1,in_RDX);
  return pTVar1;
}

Assistant:

TestOutput* CommandLineTestRunner::createCompositeOutput(TestOutput* outputOne, TestOutput* outputTwo)
{
  CompositeTestOutput* composite = new CompositeTestOutput;
  composite->setOutputOne(outputOne);
  composite->setOutputTwo(outputTwo);
  return composite;
}